

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

GCstr * lj_lib_checkstr(lua_State *L,int narg)

{
  GCstr *pGVar1;
  ulong uVar2;
  cTValue *o;
  
  o = L->base + (long)narg + -1;
  if (o < L->top) {
    uVar2 = o->it64 >> 0x2f;
    if (uVar2 == 0xfffffffffffffffb) {
      pGVar1 = (GCstr *)(o->it64 & 0x7fffffffffff);
    }
    else {
      if (0xfffffffffffffff2 < uVar2) goto LAB_0011dc3e;
      pGVar1 = lj_strfmt_number(L,o);
      o->u64 = (ulong)pGVar1 | 0xfffd800000000000;
    }
    return pGVar1;
  }
LAB_0011dc3e:
  lj_err_argt(L,narg,4);
}

Assistant:

GCstr *lj_lib_checkstr(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (LJ_LIKELY(tvisstr(o))) {
      return strV(o);
    } else if (tvisnumber(o)) {
      GCstr *s = lj_strfmt_number(L, o);
      setstrV(L, o, s);
      return s;
    }
  }
  lj_err_argt(L, narg, LUA_TSTRING);
  return NULL;  /* unreachable */
}